

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMMemoryCopyFillLowering.cpp
# Opt level: O3

void __thiscall
wasm::LLVMMemoryCopyFillLowering::visitMemoryCopy(LLVMMemoryCopyFillLowering *this,MemoryCopy *curr)

{
  Call *expression;
  bool in_CL;
  initializer_list<wasm::Expression_*> __l;
  string_view target;
  Expression *local_78;
  Expression *pEStack_70;
  Expression *local_68;
  Builder local_58;
  Builder builder;
  pointer local_40;
  allocator_type local_31;
  
  if ((curr->destMemory).super_IString.str._M_str == (curr->sourceMemory).super_IString.str._M_str)
  {
    local_58.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::LLVMMemoryCopyFillLowering,_wasm::Visitor<wasm::LLVMMemoryCopyFillLowering,_void>_>_>
         ).
         super_PostWalker<wasm::LLVMMemoryCopyFillLowering,_wasm::Visitor<wasm::LLVMMemoryCopyFillLowering,_void>_>
         .
         super_Walker<wasm::LLVMMemoryCopyFillLowering,_wasm::Visitor<wasm::LLVMMemoryCopyFillLowering,_void>_>
         .currModule;
    target = IString::interned((IString *)0xd,(string_view)ZEXT816(0xde89f0),in_CL);
    local_78 = curr->dest;
    pEStack_70 = curr->source;
    local_68 = curr->size;
    __l._M_len = 3;
    __l._M_array = &local_78;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,__l,
               &local_31);
    expression = Builder::makeCall(&local_58,(Name)target,
                                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    *)&builder,(Type)0x0,false);
    Walker<wasm::LLVMMemoryCopyFillLowering,_wasm::Visitor<wasm::LLVMMemoryCopyFillLowering,_void>_>
    ::replaceCurrent(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::LLVMMemoryCopyFillLowering,_wasm::Visitor<wasm::LLVMMemoryCopyFillLowering,_void>_>_>
                      ).
                      super_PostWalker<wasm::LLVMMemoryCopyFillLowering,_wasm::Visitor<wasm::LLVMMemoryCopyFillLowering,_void>_>
                      .
                      super_Walker<wasm::LLVMMemoryCopyFillLowering,_wasm::Visitor<wasm::LLVMMemoryCopyFillLowering,_void>_>
                     ,(Expression *)expression);
    if (builder.wasm != (Module *)0x0) {
      operator_delete(builder.wasm,(long)local_40 - (long)builder.wasm);
    }
    this->needsMemoryCopy = true;
    return;
  }
  __assert_fail("curr->destMemory == curr->sourceMemory",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LLVMMemoryCopyFillLowering.cpp"
                ,0x25,"void wasm::LLVMMemoryCopyFillLowering::visitMemoryCopy(MemoryCopy *)");
}

Assistant:

void visitMemoryCopy(MemoryCopy* curr) {
    assert(curr->destMemory ==
           curr->sourceMemory); // multi-memory not supported.
    Builder builder(*getModule());
    replaceCurrent(builder.makeCall(
      "__memory_copy", {curr->dest, curr->source, curr->size}, Type::none));
    needsMemoryCopy = true;
  }